

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompress.c
# Opt level: O0

void makeMaps_d(DState *s)

{
  int local_14;
  Int32 i;
  DState *s_local;
  
  s->nInUse = 0;
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    if (s->inUse[local_14] != '\0') {
      s->seqToUnseq[s->nInUse] = (UChar)local_14;
      s->nInUse = s->nInUse + 1;
    }
  }
  return;
}

Assistant:

static
void makeMaps_d ( DState* s )
{
   Int32 i;
   s->nInUse = 0;
   for (i = 0; i < 256; i++)
      if (s->inUse[i]) {
         s->seqToUnseq[s->nInUse] = i;
         s->nInUse++;
      }
}